

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battle_check.cpp
# Opt level: O1

void def_check(int *shielding,bool *defend,int *damage)

{
  ostream *poVar1;
  long *plVar2;
  int iVar3;
  
  iVar3 = *shielding;
  if ((iVar3 == 0) && (*defend == true)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_30a24,0x13);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)((double)*damage * 0.6))
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,anon_var_dwarf_30a7c + 0x14,10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    plVar2 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    *damage = (int)((double)*damage * 0.4);
    *defend = false;
  }
  else if (0 < iVar3) {
    if (*defend == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_30a50,0x11);
      iVar3 = *damage;
    }
    else {
      if (iVar3 < 1) {
        return;
      }
      if (*defend != true) {
        return;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_30a7c,0x1e);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
      std::ostream::put('\x10');
      plVar2 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      *defend = false;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_30a50,0x11);
      iVar3 = *damage;
    }
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,anon_var_dwarf_30a66,0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    *damage = 0;
  }
  return;
}

Assistant:

void def_check(int* shielding,bool* defend,int* damage){
    if(*shielding==0&&*defend==true)
    {
        cout<<"勇者防禦住了 "<<int(*damage*0.6)<<" 點傷害"<<endl<<endl;
        *damage=*damage*0.4;
        *defend=false;
    }
    else if(*shielding>0&&*defend==false)
    {
        cout<<"(護盾吸收了 "<<*damage<<" 點傷害)"<<endl;
        *damage=0;
    }
    else if(*shielding>0&&*defend==true)
    {
        cout<<"勇者防禦住了 0 點傷害"<<endl<<endl;
        *defend=false;
        cout<<"(護盾吸收了 "<<*damage<<" 點傷害)"<<endl;
        *damage=0;
    }
}